

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  uint uVar1;
  undefined1 auVar2 [16];
  char cVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  
  uVar11 = 0xb;
  if (tableLog != 0) {
    uVar11 = tableLog;
  }
  if (uVar11 < 5) {
    return 0xffffffffffffffff;
  }
  if (0xc < uVar11) {
    return 0xffffffffffffffd4;
  }
  uVar5 = FSE_minTableLog(total,maxSymbolValue);
  if (uVar11 < uVar5) {
    return 0xffffffffffffffff;
  }
  bVar4 = (byte)uVar11;
  cVar3 = -bVar4;
  bVar7 = cVar3 + 0x3e;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = total;
  iVar16 = 1 << (bVar4 & 0x1f);
  uVar6 = 0;
  uVar5 = 0;
  uVar14 = 0;
  iVar17 = iVar16;
  do {
    uVar10 = (ulong)count[uVar14];
    if (uVar10 == total) {
      return 0;
    }
    uVar15 = (uint)(total >> (bVar4 & 0x3f));
    if (uVar10 == 0) {
      normalizedCounter[uVar14] = 0;
    }
    else if (uVar15 < count[uVar14]) {
      uVar10 = uVar10 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar2,0);
      uVar13 = uVar10 >> (bVar7 & 0x3f);
      if ((uVar13 & 0xfff8) == 0) {
        uVar13 = (ulong)((int)uVar13 +
                        (uint)((ulong)FSE_normalizeCount::rtbTable[uVar13 & 0xffff] <<
                               (cVar3 + 0x2aU & 0x3f) <
                              uVar10 - ((uVar13 & 0xffff) << (bVar7 & 0x3f))));
      }
      uVar8 = (ushort)uVar13;
      if ((ushort)uVar6 < uVar8) {
        uVar5 = uVar14;
      }
      if ((ushort)uVar6 < uVar8) {
        uVar6 = uVar13 & 0xffff;
      }
      normalizedCounter[uVar14] = uVar8;
      iVar17 = iVar17 - (int)(uVar13 & 0xffff);
    }
    else {
      normalizedCounter[uVar14] = -1;
      iVar17 = iVar17 + -1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 <= maxSymbolValue);
  iVar12 = (int)normalizedCounter[uVar5] >> 1;
  if (iVar12 != -iVar17 && SBORROW4(iVar12,-iVar17) == iVar12 + iVar17 < 0) {
    normalizedCounter[uVar5] = normalizedCounter[uVar5] + (short)iVar17;
    return (ulong)uVar11;
  }
  uVar10 = total * 3 >> (bVar4 + 1 & 0x3f);
  uVar5 = maxSymbolValue + 1;
  uVar13 = (ulong)(maxSymbolValue + 1 + (uint)(uVar5 == 0));
  uVar6 = 0;
  uVar14 = 0;
  do {
    uVar1 = count[uVar6];
    if ((ulong)uVar1 == 0) {
      normalizedCounter[uVar6] = 0;
    }
    else {
      if (uVar15 < uVar1) {
        if ((uint)uVar10 < uVar1) {
          normalizedCounter[uVar6] = -2;
          goto LAB_0010971e;
        }
        normalizedCounter[uVar6] = 1;
      }
      else {
        normalizedCounter[uVar6] = -1;
      }
      uVar14 = uVar14 + 1;
      total = total - uVar1;
    }
LAB_0010971e:
    uVar6 = uVar6 + 1;
  } while (uVar13 != uVar6);
  uVar15 = iVar16 - uVar14;
  if (uVar15 != 0) {
    if ((uVar10 & 0xffffffff) < total / uVar15) {
      uVar6 = total * 3;
      uVar10 = 0;
      do {
        if ((normalizedCounter[uVar10] == -2) &&
           (uVar1 = count[uVar10], uVar1 <= (uint)(uVar6 / (uVar15 * 2)))) {
          normalizedCounter[uVar10] = 1;
          uVar14 = uVar14 + 1;
          total = total - uVar1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
      uVar15 = iVar16 - uVar14;
    }
    if (uVar14 != uVar5) {
      if (total == 0) {
        uVar6 = 0;
        if (uVar15 != 0) {
          uVar10 = 0;
          do {
            if (0 < normalizedCounter[uVar10]) {
              uVar15 = uVar15 - 1;
              normalizedCounter[uVar10] = normalizedCounter[uVar10] + 1;
            }
            uVar10 = (ulong)((int)uVar10 + 1) % (ulong)uVar5;
          } while (uVar15 != 0);
        }
      }
      else {
        uVar10 = ~(-1L << (cVar3 + 0x3dU & 0x3f));
        uVar6 = ((ulong)uVar15 << (bVar7 & 0x3f)) + uVar10;
        uVar5 = 0;
        bVar9 = true;
        do {
          if (normalizedCounter[uVar5] == -2) {
            uVar13 = uVar10 >> (bVar7 & 0x3f);
            uVar10 = (ulong)count[uVar5] * (uVar6 / total) + uVar10;
            uVar18 = uVar10 >> (bVar7 & 0x3f);
            if (uVar18 == uVar13) break;
            normalizedCounter[uVar5] = (short)uVar18 - (short)uVar13;
          }
          uVar5 = uVar5 + 1;
          bVar9 = uVar5 <= maxSymbolValue;
        } while (uVar5 <= maxSymbolValue);
        uVar6 = -(ulong)bVar9;
      }
      goto LAB_00109854;
    }
    uVar10 = 0;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar5 < count[uVar10]) {
        uVar6 = uVar10 & 0xffffffff;
        uVar5 = count[uVar10];
      }
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    normalizedCounter[uVar6] = normalizedCounter[uVar6] + (short)uVar15;
  }
  uVar6 = 0;
LAB_00109854:
  uVar10 = (ulong)uVar11;
  if (0xffffffffffffff88 < uVar6) {
    uVar10 = uVar6;
  }
  return uVar10;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}